

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void __thiscall Search::predictor::set_input_length(predictor *this,size_t input_length)

{
  void *pvVar1;
  undefined8 uVar2;
  example *peVar3;
  long in_RSI;
  undefined1 *in_RDI;
  stringstream __msg;
  example *temp;
  string *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe44;
  char *in_stack_fffffffffffffe48;
  vw_exception *in_stack_fffffffffffffe50;
  stringstream local_1a0 [16];
  ostream local_190;
  size_t in_stack_ffffffffffffffe8;
  
  *in_RDI = 1;
  if ((in_RDI[0x18] & 1) == 0) {
    peVar3 = calloc_or_throw<example>(in_stack_ffffffffffffffe8);
    *(example **)(in_RDI + 8) = peVar3;
  }
  else {
    pvVar1 = realloc(*(void **)(in_RDI + 8),in_RSI * 0x68d0);
    if (pvVar1 == (void *)0x0) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      std::operator<<(&local_190,"realloc failed in search.cc");
      uVar2 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                 in_stack_fffffffffffffe38);
      __cxa_throw(uVar2,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    *(void **)(in_RDI + 8) = pvVar1;
  }
  *(long *)(in_RDI + 0x10) = in_RSI;
  in_RDI[0x18] = 1;
  return;
}

Assistant:

void predictor::set_input_length(size_t input_length)
{
  is_ldf = true;
  if (ec_alloced)
  {
    example* temp = (example*)realloc(ec, input_length * sizeof(example));
    if (temp != nullptr)
      ec = temp;
    else
      THROW("realloc failed in search.cc");
  }
  else
    ec = calloc_or_throw<example>(input_length);
  ec_cnt = input_length;
  ec_alloced = true;
}